

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.hpp
# Opt level: O1

void __thiscall
boost::filesystem::filesystem_error::filesystem_error
          (filesystem_error *this,string *what_arg,path *path1_arg,error_code ec)

{
  element_type *peVar1;
  m_imp *p;
  
  std::runtime_error::runtime_error((runtime_error *)this,(string *)what_arg);
  (this->super_system_error).m_error_code.m_val = ec.m_val;
  (this->super_system_error).m_error_code.m_cat = ec.m_cat;
  (this->super_system_error).m_what._M_dataplus._M_p =
       (pointer)&(this->super_system_error).m_what.field_2;
  (this->super_system_error).m_what._M_string_length = 0;
  (this->super_system_error).m_what.field_2._M_local_buf[0] = '\0';
  *(undefined ***)&this->super_system_error = &PTR__filesystem_error_00119980;
  (this->m_imp_ptr).px = (element_type *)0x0;
  (this->m_imp_ptr).pn.pi_ = (sp_counted_base *)0x0;
  p = (m_imp *)operator_new(0x60);
  (p->m_path1).m_pathname._M_dataplus._M_p = (pointer)&(p->m_path1).m_pathname.field_2;
  (p->m_path1).m_pathname._M_string_length = 0;
  (p->m_path1).m_pathname.field_2._M_local_buf[0] = '\0';
  (p->m_path2).m_pathname._M_dataplus._M_p = (pointer)&(p->m_path2).m_pathname.field_2;
  (p->m_path2).m_pathname._M_string_length = 0;
  (p->m_path2).m_pathname.field_2._M_local_buf[0] = '\0';
  (p->m_what)._M_dataplus._M_p = (pointer)&(p->m_what).field_2;
  (p->m_what)._M_string_length = 0;
  (p->m_what).field_2._M_local_buf[0] = '\0';
  shared_ptr<boost::filesystem::filesystem_error::m_imp>::
  reset<boost::filesystem::filesystem_error::m_imp>(&this->m_imp_ptr,p);
  peVar1 = (this->m_imp_ptr).px;
  if (peVar1 != (element_type *)0x0) {
    std::__cxx11::string::_M_assign((string *)peVar1);
    return;
  }
  __assert_fail("px != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/boost/smart_ptr/shared_ptr.hpp"
                ,0x2b5,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::filesystem::filesystem_error::m_imp>::operator->() const [T = boost::filesystem::filesystem_error::m_imp]"
               );
}

Assistant:

filesystem_error(
        const std::string & what_arg, const path& path1_arg,
        system::error_code ec) BOOST_NOEXCEPT
        : system::system_error(ec, what_arg)
      {
        try
        {
          m_imp_ptr.reset(new m_imp);
          m_imp_ptr->m_path1 = path1_arg;
        }
        catch (...) { m_imp_ptr.reset(); }
      }